

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O3

void __thiscall BBDT<TTA>::PerformLabeling(BBDT<TTA> *this)

{
  long lVar1;
  undefined8 uVar2;
  char cVar3;
  uint uVar4;
  Mat1b *pMVar5;
  Mat1i *pMVar6;
  uint *puVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined4 uVar18;
  ulong uVar19;
  int iVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  uint local_c8;
  Mat local_90 [96];
  ulong uVar20;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar13 = *(uint *)&pMVar5->field_0x8;
  uVar12 = (ulong)uVar13;
  iVar21 = *(int *)&pMVar5->field_0xc;
  lVar26 = (long)iVar21;
  cv::Mat::Mat(local_90,**(int **)&pMVar5->field_0x40,(*(int **)&pMVar5->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  uVar9 = 1;
  if (0 < (int)uVar13) {
    uVar19 = 0;
    do {
      if (0 < iVar21) {
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar14 = **(long **)&pMVar5->field_0x48;
        lVar16 = lVar14 * uVar19 + *(long *)&pMVar5->field_0x10;
        lVar27 = lVar16 - lVar14;
        lVar23 = lVar27 - lVar14;
        lVar24 = **(long **)&pMVar6->field_0x48;
        lVar28 = lVar24 * uVar19 + *(long *)&pMVar6->field_0x10;
        lVar14 = lVar14 + lVar16;
        lVar24 = lVar28 + lVar24 * -2;
        uVar10 = uVar19 | 1;
        uVar31 = 0;
        do {
          if (*(char *)(lVar16 + uVar31) == '\0') {
            if ((uVar10 < uVar12) && (*(char *)(lVar14 + uVar31) != '\0')) {
              uVar11 = uVar31 | 1;
              if ((lVar26 <= (long)uVar11) || (*(char *)(lVar16 + uVar11) == '\0')) {
                if ((uVar31 != 0) &&
                   ((*(char *)((uVar31 - 1) + lVar14) != '\0' ||
                    (*(char *)(lVar16 + -1 + uVar31) != '\0')))) goto LAB_0019ceba;
                goto LAB_0019cb95;
              }
              if (uVar31 == 0) {
LAB_0019c886:
                if (uVar19 == 0) goto LAB_0019cb95;
                if (*(char *)(lVar27 + (uVar31 | 1)) == '\0') {
                  if (((long)(uVar31 + 2) < lVar26) && (*(char *)(lVar27 + uVar31 + 2) != '\0')) {
                    if (*(char *)(lVar27 + uVar31) == '\0') goto LAB_0019cc4e;
                    goto LAB_0019ca39;
                  }
                  if (*(char *)(lVar27 + uVar31) == '\0') goto LAB_0019cb95;
                }
                goto LAB_0019cb8c;
              }
              if (*(char *)((uVar31 - 1) + lVar16) != '\0') {
                if (uVar19 != 0) {
                  if (*(char *)(lVar27 + uVar11) != '\0') goto LAB_0019c7b9;
                  if (((long)(uVar31 + 2) < lVar26) && (*(char *)(lVar27 + uVar31 + 2) != '\0')) {
                    if (*(char *)(lVar23 + uVar11) != '\0') {
                      if (*(char *)(lVar27 + uVar31) == '\0') goto LAB_0019c911;
                      goto LAB_0019ce05;
                    }
                    uVar9 = *(uint *)(lVar24 + 8 + uVar31 * 4);
                    goto LAB_0019cf14;
                  }
                }
                goto LAB_0019ceba;
              }
              if (*(char *)(lVar14 + -1 + uVar31) == '\0') goto LAB_0019c886;
              if (uVar19 == 0) goto LAB_0019ceba;
              if (*(char *)(lVar27 + uVar11) == '\0') {
                if (((long)(uVar31 + 2) < lVar26) && (*(char *)(lVar27 + uVar31 + 2) != '\0')) {
                  if (*(char *)(lVar23 + uVar11) != '\0') {
                    if ((*(char *)((uVar31 - 2) + lVar16) == '\0') ||
                       ((*(char *)(lVar27 + -1 + uVar31) == '\0' &&
                        ((*(char *)(lVar27 + -2 + uVar31) == '\0' ||
                         (*(char *)(lVar23 + -1 + uVar31) == '\0')))))) goto LAB_0019d077;
                    if (*(char *)(lVar27 + uVar31) == '\0') {
                      cVar3 = *(char *)(lVar23 + uVar31);
                      goto joined_r0x0019cb4e;
                    }
LAB_0019cc84:
                    uVar9 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                    goto LAB_0019d090;
                  }
                  if (*(char *)(lVar27 + uVar31) == '\0') goto LAB_0019d03f;
                  if (*(char *)((uVar31 - 2) + lVar16) == '\0') {
LAB_0019d0d5:
                    uVar9 = TTA::Merge(*(uint *)(lVar24 + uVar31 * 4),
                                       *(uint *)(lVar24 + 8 + uVar31 * 4));
                    uVar22 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                  }
                  else {
                    if (*(char *)(lVar27 + -1 + uVar31) == '\0') {
                      if (*(char *)(lVar27 + -2 + uVar31) != '\0') {
                        cVar3 = *(char *)(lVar23 + -1 + uVar31);
                        goto joined_r0x0019d0ca;
                      }
                      goto LAB_0019d0d5;
                    }
                    uVar9 = *(uint *)(lVar24 + 8 + uVar31 * 4);
                    uVar22 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                  }
                  uVar9 = TTA::Merge(uVar9,uVar22);
                  *(uint *)(lVar28 + uVar31 * 4) = uVar9;
                  goto LAB_0019cec3;
                }
                if (*(char *)(lVar27 + uVar31) == '\0') goto LAB_0019ceba;
                if (*(char *)((uVar31 - 2) + lVar16) == '\0') goto LAB_0019ce0f;
                if (*(char *)(lVar27 + -1 + uVar31) == '\0') goto LAB_0019cc6c;
LAB_0019ce05:
                uVar9 = *(uint *)(lVar28 + -8 + uVar31 * 4);
              }
              else {
                if (*(char *)((uVar31 - 2) + lVar16) != '\0') {
                  if (*(char *)(lVar27 + -1 + uVar31) == '\0') {
                    if ((*(char *)(lVar27 + -2 + uVar31) == '\0') ||
                       (*(char *)(lVar23 + -1 + uVar31) == '\0')) goto LAB_0019ce94;
                    if (*(char *)(lVar27 + uVar31) != '\0') goto LAB_0019cc84;
                    cVar3 = *(char *)(lVar23 + uVar31);
                  }
                  else {
                    if (*(char *)(lVar27 + uVar31) != '\0') goto LAB_0019ce05;
                    cVar3 = *(char *)(lVar23 + uVar31);
                  }
                  goto joined_r0x0019ce8d;
                }
LAB_0019ce0f:
                uVar9 = *(uint *)(lVar24 + uVar31 * 4);
LAB_0019cf14:
                uVar9 = TTA::Merge(uVar9,*(uint *)(lVar28 + -8 + uVar31 * 4));
              }
              *(uint *)(lVar28 + uVar31 * 4) = uVar9;
            }
            else {
              uVar11 = uVar31 | 1;
              if ((long)uVar11 < lVar26) {
                if (*(char *)(lVar16 + uVar11) != '\0') goto LAB_0019c886;
                if ((uVar10 < uVar12) && (*(char *)(lVar14 + uVar11) != '\0')) goto LAB_0019cb95;
              }
              *(undefined4 *)(lVar28 + uVar31 * 4) = 0;
            }
          }
          else {
            if (uVar31 == 0) {
LAB_0019c9ad:
              uVar11 = uVar31 | 1;
              if ((uVar19 == 0) ||
                 ((lVar26 <= (long)uVar11 || (*(char *)(lVar27 + uVar11) == '\0')))) {
                if (((long)uVar11 < lVar26) && (*(char *)(lVar16 + uVar11) != '\0')) {
                  if ((uVar19 == 0) || (lVar26 <= (long)(uVar31 + 2))) {
                    if (uVar19 == 0) goto LAB_0019cb95;
                  }
                  else if (*(char *)(lVar27 + uVar31 + 2) != '\0') {
                    if (*(char *)(lVar27 + uVar31) == '\0') {
                      if ((uVar31 != 0) && (*(char *)(lVar27 + -1 + uVar31) != '\0')) {
                        if ((*(char *)(lVar23 + uVar11) == '\0') ||
                           (*(char *)(lVar23 + uVar31) == '\0')) {
                          uVar9 = *(uint *)(lVar24 + -8 + uVar31 * 4);
                          uVar22 = *(uint *)(lVar24 + 8 + uVar31 * 4);
                          goto LAB_0019d081;
                        }
                        uVar9 = *(uint *)(lVar24 + 8 + uVar31 * 4);
                        goto LAB_0019d090;
                      }
                    }
                    else {
LAB_0019ca39:
                      if (*(char *)(lVar23 + (uVar31 | 1)) == '\0') {
                        uVar9 = *(uint *)(lVar24 + uVar31 * 4);
                        uVar22 = *(uint *)(lVar24 + 8 + uVar31 * 4);
                        goto LAB_0019cca3;
                      }
                    }
LAB_0019cc4e:
                    uVar9 = *(uint *)(lVar24 + 8 + uVar31 * 4);
                    goto LAB_0019cebf;
                  }
                  if (*(char *)(lVar27 + uVar31) != '\0') goto LAB_0019cb8c;
                  if (uVar19 != 0 && uVar31 != 0) {
LAB_0019cade:
                    if (*(char *)(lVar27 + -1 + uVar31) != '\0') {
                      uVar9 = *(uint *)(lVar24 + -8 + uVar31 * 4);
                      goto LAB_0019cebf;
                    }
                  }
                }
                else if (uVar19 != 0) {
                  if (*(char *)(lVar27 + uVar31) != '\0') goto LAB_0019cb8c;
                  if (uVar31 != 0) goto LAB_0019cade;
                }
LAB_0019cb95:
                uVar11 = (ulong)TTA::length_;
                TTA::rtable_[uVar11] = TTA::length_;
                TTA::next_[uVar11] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar9 = TTA::length_ + 1;
                *(uint *)(lVar28 + uVar31 * 4) = TTA::length_;
                TTA::length_ = uVar9;
                goto LAB_0019cec3;
              }
              if ((((*(char *)(lVar27 + uVar31) == '\0') && (uVar31 != 0)) &&
                  (*(char *)(lVar27 + -1 + uVar31) != '\0')) && (*(char *)(lVar23 + uVar31) == '\0')
                 ) {
                uVar9 = *(uint *)(lVar24 + -8 + uVar31 * 4);
                uVar22 = *(uint *)(lVar24 + uVar31 * 4);
                goto LAB_0019cca3;
              }
LAB_0019cb8c:
              uVar9 = *(uint *)(lVar24 + uVar31 * 4);
            }
            else if (*(char *)(lVar16 + -1 + uVar31) == '\0') {
              if ((uVar12 <= uVar10) || (*(char *)(lVar14 + -1 + uVar31) == '\0'))
              goto LAB_0019c9ad;
              uVar11 = uVar31 | 1;
              if (((uVar19 == 0) || (lVar26 <= (long)uVar11)) ||
                 (*(char *)(lVar27 + uVar11) == '\0')) {
                if (((lVar26 <= (long)uVar11) || (*(char *)(lVar16 + uVar11) == '\0')) ||
                   ((uVar19 == 0 ||
                    ((lVar26 <= (long)(uVar31 + 2) || (*(char *)(lVar27 + uVar31 + 2) == '\0'))))))
                {
                  if (uVar19 != 0) {
                    if (*(char *)(lVar27 + -1 + uVar31) == '\0') {
                      if (*(char *)(lVar27 + uVar31) != '\0') {
                        if (*(char *)((uVar31 - 2) + lVar16) != '\0') {
LAB_0019cc6c:
                          cVar3 = *(char *)(lVar27 + -2 + uVar31);
                          goto joined_r0x0019c7e2;
                        }
                        goto LAB_0019cc9a;
                      }
                    }
                    else if (*(char *)((uVar31 - 2) + lVar16) == '\0') {
                      uVar9 = *(uint *)(lVar24 + -8 + uVar31 * 4);
                      goto LAB_0019cc9e;
                    }
                  }
                  goto LAB_0019ceba;
                }
                if (*(char *)((uVar31 - 2) + lVar16) != '\0') {
                  if (*(char *)(lVar27 + -1 + uVar31) == '\0') {
                    if (*(char *)(lVar23 + uVar11) != '\0') {
                      if ((*(char *)(lVar27 + -2 + uVar31) == '\0') ||
                         (*(char *)(lVar23 + -1 + uVar31) == '\0')) {
                        uVar9 = TTA::Merge(*(uint *)(lVar24 + 8 + uVar31 * 4),
                                           *(uint *)(lVar28 + -8 + uVar31 * 4));
                      }
                      else {
                        if (*(char *)(lVar27 + uVar31) == '\0') {
                          cVar3 = *(char *)(lVar23 + uVar31);
                          goto joined_r0x0019cb4e;
                        }
                        uVar9 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                      }
                      *(uint *)(lVar28 + uVar31 * 4) = uVar9;
                      goto LAB_0019cec3;
                    }
                    if (*(char *)(lVar27 + uVar31) != '\0') {
                      if (*(char *)(lVar27 + -2 + uVar31) == '\0') {
                        uVar9 = *(uint *)(lVar24 + uVar31 * 4);
                        goto LAB_0019d04d;
                      }
                      cVar3 = *(char *)(lVar23 + -1 + uVar31);
                      goto joined_r0x0019d0ca;
                    }
                  }
                  else if (*(char *)(lVar23 + uVar11) != '\0') {
                    if (*(char *)(lVar27 + uVar31) == '\0') {
                      cVar3 = *(char *)(lVar23 + uVar31);
joined_r0x0019cb4e:
                      if (cVar3 == '\0') goto LAB_0019d03f;
                    }
                    goto LAB_0019ceba;
                  }
LAB_0019d03f:
                  uVar9 = *(uint *)(lVar24 + 8 + uVar31 * 4);
                  goto LAB_0019cc9e;
                }
                if (*(char *)(lVar27 + uVar31) != '\0') {
                  cVar3 = *(char *)(lVar23 + uVar11);
joined_r0x0019d0ca:
                  if (cVar3 != '\0') {
LAB_0019cdd6:
                    uVar9 = *(uint *)(lVar24 + 8 + uVar31 * 4);
                    goto LAB_0019cddb;
                  }
                  uVar9 = *(uint *)(lVar24 + uVar31 * 4);
LAB_0019cfb2:
                  uVar22 = *(uint *)(lVar24 + 8 + uVar31 * 4);
                  goto LAB_0019cfb7;
                }
                if (*(char *)(lVar27 + -1 + uVar31) == '\0') goto LAB_0019d03f;
                if (*(char *)(lVar23 + uVar11) != '\0') {
                  if (*(char *)(lVar23 + uVar31) != '\0') goto LAB_0019cdd6;
                  uVar9 = *(uint *)(lVar24 + -8 + uVar31 * 4);
                  goto LAB_0019cfb2;
                }
                uVar9 = *(uint *)(lVar24 + -8 + uVar31 * 4);
LAB_0019d04d:
                uVar9 = TTA::Merge(uVar9,*(uint *)(lVar24 + 8 + uVar31 * 4));
                uVar22 = *(uint *)(lVar28 + -8 + uVar31 * 4);
              }
              else {
                if (*(char *)((uVar31 - 2) + lVar16) == '\0') {
                  if ((*(char *)(lVar27 + uVar31) == '\0') &&
                     (*(char *)(lVar27 + -1 + uVar31) != '\0')) {
                    if (*(char *)(lVar23 + uVar31) == '\0') {
                      uVar9 = *(uint *)(lVar24 + -8 + uVar31 * 4);
                      uVar22 = *(uint *)(lVar24 + uVar31 * 4);
LAB_0019cfb7:
                      uVar9 = TTA::Merge(uVar9,uVar22);
                      uVar22 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                    }
                    else {
                      uVar9 = *(uint *)(lVar24 + uVar31 * 4);
LAB_0019cddb:
                      uVar22 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                    }
                    uVar9 = TTA::Merge(uVar9,uVar22);
                    *(uint *)(lVar28 + uVar31 * 4) = uVar9;
                    goto LAB_0019cec3;
                  }
                }
                else {
                  if (*(char *)(lVar27 + -1 + uVar31) == '\0') {
                    if ((*(char *)(lVar27 + -2 + uVar31) == '\0') ||
                       (*(char *)(lVar23 + -1 + uVar31) == '\0')) {
                      uVar9 = TTA::Merge(*(uint *)(lVar24 + uVar31 * 4),
                                         *(uint *)(lVar28 + -8 + uVar31 * 4));
                    }
                    else {
                      if (*(char *)(lVar27 + uVar31) == '\0') {
                        cVar3 = *(char *)(lVar23 + uVar31);
                        goto joined_r0x0019ce8d;
                      }
                      uVar9 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                    }
                    *(uint *)(lVar28 + uVar31 * 4) = uVar9;
                    goto LAB_0019cec3;
                  }
                  if (*(char *)(lVar27 + uVar31) != '\0') goto LAB_0019ceba;
                  cVar3 = *(char *)(lVar23 + uVar31);
joined_r0x0019ce8d:
                  if (cVar3 != '\0') goto LAB_0019ceba;
                }
LAB_0019cc9a:
                uVar9 = *(uint *)(lVar24 + uVar31 * 4);
LAB_0019cc9e:
                uVar22 = *(uint *)(lVar28 + -8 + uVar31 * 4);
              }
LAB_0019cca3:
              uVar9 = TTA::Merge(uVar9,uVar22);
            }
            else {
              uVar11 = uVar31 | 1;
              if (((uVar19 == 0) || (lVar26 <= (long)uVar11)) ||
                 (*(char *)(lVar27 + uVar11) == '\0')) {
                if ((((long)uVar11 < lVar26) && (*(char *)(lVar16 + uVar11) != '\0')) &&
                   ((uVar19 != 0 &&
                    (((long)(uVar31 + 2) < lVar26 && (*(char *)(lVar27 + uVar31 + 2) != '\0')))))) {
                  if (*(char *)(lVar23 + uVar11) != '\0') {
                    if (*(char *)(lVar27 + uVar31) != '\0') goto LAB_0019cc84;
LAB_0019c911:
                    if ((*(char *)(lVar23 + uVar31) != '\0') &&
                       ((*(char *)(lVar27 + -1 + uVar31) != '\0' ||
                        ((*(char *)((uVar31 - 2) + lVar27) != '\0' &&
                         (*(char *)(lVar23 + -1 + uVar31) != '\0')))))) goto LAB_0019cc84;
                  }
LAB_0019d077:
                  uVar9 = *(uint *)(lVar24 + 8 + uVar31 * 4);
                  goto LAB_0019d07c;
                }
              }
              else {
LAB_0019c7b9:
                if (*(char *)(lVar27 + uVar31) == '\0') {
                  if (*(char *)(lVar23 + uVar31) != '\0') {
                    if (*(char *)(lVar27 + -1 + uVar31) != '\0') goto LAB_0019cc84;
                    cVar3 = *(char *)((uVar31 - 2) + lVar27);
joined_r0x0019c7e2:
                    if ((cVar3 != '\0') && (*(char *)(lVar23 + -1 + uVar31) != '\0'))
                    goto LAB_0019cc84;
                  }
LAB_0019ce94:
                  uVar9 = *(uint *)(lVar24 + uVar31 * 4);
LAB_0019d07c:
                  uVar22 = *(uint *)(lVar28 + -8 + uVar31 * 4);
LAB_0019d081:
                  uVar9 = TTA::Merge(uVar9,uVar22);
LAB_0019d090:
                  *(uint *)(lVar28 + uVar31 * 4) = uVar9;
                  goto LAB_0019cec3;
                }
              }
LAB_0019ceba:
              uVar9 = *(uint *)(lVar28 + -8 + uVar31 * 4);
            }
LAB_0019cebf:
            *(uint *)(lVar28 + uVar31 * 4) = uVar9;
          }
LAB_0019cec3:
          uVar31 = uVar31 + 2;
        } while ((long)uVar31 < lVar26);
      }
      puVar7 = TTA::rtable_;
      uVar19 = uVar19 + 2;
    } while ((int)uVar19 < (int)uVar13);
    uVar9 = 1;
    if (1 < TTA::length_) {
      uVar12 = 1;
      do {
        if (uVar12 == puVar7[uVar12]) {
          uVar9 = uVar9 + 1;
          uVar13 = uVar9;
        }
        else {
          uVar13 = puVar7[puVar7[uVar12]];
        }
        puVar7[uVar12] = uVar13;
        uVar12 = uVar12 + 1;
      } while (uVar12 < TTA::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
  puVar7 = TTA::rtable_;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar13 = *(uint *)&pMVar6->field_0x8;
  uVar22 = uVar13 & 0xfffffffe;
  uVar9 = *(uint *)&pMVar6->field_0xc;
  local_c8 = uVar9 & 0x80000001;
  uVar19 = (long)(int)uVar9 & 0xfffffffffffffffe;
  uVar12 = 0;
  iVar21 = (int)uVar19;
  if (0 < (int)uVar22) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar24 = *(long *)&pMVar5->field_0x10;
    lVar16 = **(long **)&pMVar5->field_0x48;
    lVar23 = *(long *)&pMVar6->field_0x10;
    lVar27 = **(long **)&pMVar6->field_0x48;
    lVar26 = lVar23 + lVar27;
    lVar14 = lVar24 + 1 + lVar16;
    lVar15 = lVar24 + 1;
    uVar10 = 0;
    lVar28 = lVar23;
    do {
      puVar8 = TTA::rtable_;
      lVar17 = lVar27 * uVar10 + lVar23;
      lVar1 = lVar17 + lVar27;
      if (iVar21 < 1) {
        uVar31 = 0;
      }
      else {
        uVar31 = 0;
        do {
          lVar29 = (long)*(int *)(lVar28 + uVar31 * 4);
          if (lVar29 < 1) {
            *(undefined8 *)(lVar28 + uVar31 * 4) = 0;
            uVar11 = uVar31 + 1;
            *(undefined4 *)(lVar26 + uVar31 * 4) = 0;
            uVar18 = 0;
          }
          else {
            uVar4 = puVar8[lVar29];
            uVar25 = uVar4;
            if (*(char *)(lVar15 + -1 + uVar31) == '\0') {
              uVar25 = 0;
            }
            *(uint *)(lVar28 + uVar31 * 4) = uVar25;
            uVar11 = uVar31 | 1;
            uVar25 = uVar4;
            if (*(char *)(lVar15 + uVar31) == '\0') {
              uVar25 = 0;
            }
            *(uint *)(lVar28 + 4 + uVar31 * 4) = uVar25;
            uVar25 = uVar4;
            if (*(char *)(lVar14 + -1 + uVar31) == '\0') {
              uVar25 = 0;
            }
            *(uint *)(lVar26 + uVar31 * 4) = uVar25;
            uVar20 = (ulong)uVar4;
            if (*(char *)(lVar14 + uVar31) == '\0') {
              uVar20 = uVar12;
            }
            uVar18 = (undefined4)uVar20;
          }
          *(undefined4 *)(lVar1 + uVar11 * 4) = uVar18;
          uVar31 = uVar31 + 2;
        } while ((long)uVar31 < (long)uVar19);
      }
      if (local_c8 == 1) {
        lVar29 = (long)*(int *)(lVar17 + uVar31 * 4);
        if (lVar29 < 1) {
          *(undefined4 *)(lVar17 + uVar31 * 4) = 0;
          *(undefined4 *)(lVar1 + uVar31 * 4) = 0;
        }
        else {
          lVar30 = lVar16 * uVar10 + lVar24;
          uVar4 = puVar7[lVar29];
          uVar11 = (ulong)uVar4;
          if (*(char *)(lVar30 + uVar31) == '\0') {
            uVar11 = uVar12;
          }
          *(int *)(lVar17 + uVar31 * 4) = (int)uVar11;
          if (*(char *)(lVar30 + lVar16 + uVar31) == '\0') {
            *(undefined4 *)(lVar1 + uVar31 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + uVar31 * 4) = uVar4;
          }
        }
      }
      uVar10 = uVar10 + 2;
      lVar26 = lVar26 + lVar27 * 2;
      lVar14 = lVar14 + lVar16 * 2;
      lVar15 = lVar15 + lVar16 * 2;
      lVar28 = lVar28 + lVar27 * 2;
    } while (uVar10 < uVar22);
    uVar12 = uVar10 & 0xffffffff;
  }
  puVar7 = TTA::rtable_;
  if ((uVar13 & 0x80000001) == 1) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar26 = *(long *)&pMVar5->field_0x10;
    lVar16 = **(long **)&pMVar5->field_0x48 * uVar12;
    lVar14 = *(long *)&pMVar6->field_0x10;
    lVar24 = uVar12 * **(long **)&pMVar6->field_0x48;
    if (iVar21 < 1) {
      uVar12 = 0;
    }
    else {
      lVar23 = lVar16 + lVar26;
      lVar27 = lVar24 + lVar14;
      uVar12 = 0;
      do {
        lVar28 = (long)*(int *)(lVar27 + uVar12 * 4);
        if (lVar28 < 1) {
          *(undefined8 *)(lVar27 + uVar12 * 4) = 0;
        }
        else {
          uVar13 = puVar7[lVar28];
          uVar22 = uVar13;
          if (*(char *)(lVar23 + uVar12) == '\0') {
            uVar22 = 0;
          }
          *(uint *)(lVar27 + uVar12 * 4) = uVar22;
          if (*(char *)(lVar23 + 1 + uVar12) == '\0') {
            *(undefined4 *)(lVar27 + 4 + uVar12 * 4) = 0;
          }
          else {
            *(uint *)(lVar27 + 4 + uVar12 * 4) = uVar13;
          }
        }
        uVar12 = uVar12 + 2;
      } while (uVar12 < ((long)(int)uVar9 & 0xfffffffeU));
    }
    if (local_c8 == 1) {
      lVar14 = lVar14 + lVar24;
      lVar24 = (long)*(int *)(lVar14 + uVar12 * 4);
      uVar13 = 0;
      if ((0 < lVar24) && (uVar13 = 0, *(char *)(lVar26 + lVar16 + uVar12) != '\0')) {
        uVar13 = TTA::rtable_[lVar24];
      }
      *(uint *)(lVar14 + uVar12 * 4) = uVar13;
    }
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }